

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  string extraFlags;
  string linkLanguage;
  string linkRuleVar;
  allocator<char> local_e1;
  undefined1 local_e0 [48];
  string local_b0;
  string local_90;
  string local_70;
  cmAlphaNum local_50;
  
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            ((string *)local_e0,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage(&local_b0,this_00,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  local_e0._0_8_ = &DAT_00000006;
  local_e0._8_8_ = "CMAKE_";
  local_50.View_._M_len = local_b0._M_string_length;
  local_50.View_._M_str = local_b0._M_dataplus._M_p;
  cmStrCat<char[25]>(&local_70,(cmAlphaNum *)local_e0,&local_50,
                     (char (*) [25])"_CREATE_MACOSX_FRAMEWORK");
  local_e0._0_8_ = local_e0 + 0x10;
  local_e0._8_8_ = (char *)0x0;
  local_e0[0x10] = '\0';
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_e0,&local_b0);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS",&local_e1);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_90,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)this_01,(string *)local_e0,(string *)&local_50,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  WriteLibraryRules(this,&local_70,(string *)local_e0,relink);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_MACOSX_FRAMEWORK");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}